

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinDeserializer<boost::optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>,_void>
     ::deserialize<InputStream>
               (optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *opt,
               InputStream *istream)

{
  optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *unaff_retaddr;
  uint8_t discriminator;
  optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>
  *in_stack_ffffffffffffffc8;
  optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>
  *in_stack_ffffffffffffffd0;
  undefined1 local_11;
  
  deserialize<unsigned_char,InputStream>
            ((uchar *)in_stack_ffffffffffffffd0,(InputStream *)in_stack_ffffffffffffffc8);
  if (local_11 == '\0') {
    boost::optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>::optional
              ((optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *)
               0x16cd3f);
    boost::optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>::operator=
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    boost::optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>::~optional
              ((optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *)
               0x16cd54);
  }
  else {
    BuiltinDeserializer<boost::optional<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>,void>
    ::make_nonempty<boost::optional<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>>
              (unaff_retaddr);
    boost::optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>::operator*
              ((optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *)
               0x16cd28);
    deserialize<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>,InputStream>
              ((vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *)
               in_stack_ffffffffffffffd0,(InputStream *)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }